

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int pager_shared_lock(Pager *pPager)

{
  unqlite_kv_methods *puVar1;
  int iVar2;
  jx9_vfs *pjVar3;
  int vr;
  jx9_vfs *pVfs;
  unqlite_kv_methods *pMethods;
  int rc;
  Pager *pPager_local;
  
  pMethods._4_4_ = 0;
  if (pPager->iState == 0) {
    iVar2 = unqliteOsOpen(pPager->pVfs,pPager->pAllocator,pPager->zFilename,&pPager->pfd,
                          pPager->iOpenFlags);
    if (iVar2 != 0) {
      unqliteGenErrorFormat
                (pPager->pDb,"IO error while opening the target database file: %s",pPager->zFilename
                );
      return iVar2;
    }
    pMethods._4_4_ = pager_wait_on_lock(pPager,1);
    if (pMethods._4_4_ == 0) {
      if ((pPager->iLock < 2) && (iVar2 = pager_journal_rollback(pPager,1), iVar2 != 0)) {
        return iVar2;
      }
      iVar2 = pager_read_db_header(pPager);
      if (iVar2 != 0) {
        return iVar2;
      }
      if ((pPager->dbSize != 0) && ((pPager->iOpenFlags & 0x100) != 0)) {
        pjVar3 = jx9ExportBuiltinVfs();
        if ((pjVar3 == (jx9_vfs *)0x0) ||
           (pjVar3->xMmap == (_func_int_char_ptr_void_ptr_ptr_jx9_int64_ptr *)0x0)) {
          unqliteGenError(pPager->pDb,"Cannot obtain a read-only memory view of the target database"
                         );
          pPager->iOpenFlags = pPager->iOpenFlags & 0xfffffeff;
        }
        else {
          iVar2 = (*pjVar3->xMmap)(pPager->zFilename,&pPager->pMmap,&pPager->dbByteSize);
          if (iVar2 != 0) {
            unqliteGenError(pPager->pDb,
                            "Cannot obtain a read-only memory view of the target database");
            pPager->iOpenFlags = pPager->iOpenFlags & 0xfffffeff;
          }
        }
      }
      pPager->iState = 1;
      puVar1 = pPager->pEngine->pIo->pMethods;
      pMethods._4_4_ = 0;
      if ((puVar1->xOpen != (_func_int_unqlite_kv_engine_ptr_pgno *)0x0) &&
         (pMethods._4_4_ = (*puVar1->xOpen)(pPager->pEngine,pPager->dbSize), pMethods._4_4_ != 0)) {
        unqliteGenErrorFormat
                  (pPager->pDb,"xOpen() method of the underlying KV engine \'%z\' failed",
                   &pPager->sKv);
        pager_unlock_db(pPager,0);
        pPager->iState = 0;
        return pMethods._4_4_;
      }
    }
    else if (pMethods._4_4_ == -0xe) {
      unqliteGenError(pPager->pDb,
                      "Another process or thread have a reserved or exclusive lock on this database"
                     );
    }
  }
  return pMethods._4_4_;
}

Assistant:

static int pager_shared_lock(Pager *pPager)
{
	int rc = UNQLITE_OK;
	if( pPager->iState == PAGER_OPEN ){
		unqlite_kv_methods *pMethods;
		/* Open the target database */
		rc = unqliteOsOpen(pPager->pVfs,pPager->pAllocator,pPager->zFilename,&pPager->pfd,pPager->iOpenFlags);
		if( rc != UNQLITE_OK ){
			unqliteGenErrorFormat(pPager->pDb,
				"IO error while opening the target database file: %s",pPager->zFilename
				);
			return rc;
		}
		/* Try to obtain a shared lock */
		rc = pager_wait_on_lock(pPager,SHARED_LOCK);
		if( rc == UNQLITE_OK ){
			if( pPager->iLock <= SHARED_LOCK ){
				/* Rollback any hot journal */
				rc = pager_journal_rollback(pPager,1);
				if( rc != UNQLITE_OK ){
					return rc;
				}
			}
			/* Read the database header */
			rc = pager_read_db_header(pPager);
			if( rc != UNQLITE_OK ){
				return rc;
			}
			if(pPager->dbSize > 0 ){
				if( pPager->iOpenFlags & UNQLITE_OPEN_MMAP ){
					const jx9_vfs *pVfs = jx9ExportBuiltinVfs();
					/* Obtain a read-only memory view of the whole file */
					if( pVfs && pVfs->xMmap ){
						int vr;
						vr = pVfs->xMmap(pPager->zFilename,&pPager->pMmap,&pPager->dbByteSize);
						if( vr != JX9_OK ){
							/* Generate a warning */
							unqliteGenError(pPager->pDb,"Cannot obtain a read-only memory view of the target database");
							pPager->iOpenFlags &= ~UNQLITE_OPEN_MMAP;
						}
					}else{
						/* Generate a warning */
						unqliteGenError(pPager->pDb,"Cannot obtain a read-only memory view of the target database");
						pPager->iOpenFlags &= ~UNQLITE_OPEN_MMAP;
					}
				}
			}
			/* Update the pager state */
			pPager->iState = PAGER_READER;
			/* Invoke the xOpen methods if available */
			pMethods = pPager->pEngine->pIo->pMethods;
			if( pMethods->xOpen ){
				rc = pMethods->xOpen(pPager->pEngine,pPager->dbSize);
				if( rc != UNQLITE_OK ){
					unqliteGenErrorFormat(pPager->pDb,
						"xOpen() method of the underlying KV engine '%z' failed",
						&pPager->sKv
						);
					pager_unlock_db(pPager,NO_LOCK);
					pPager->iState = PAGER_OPEN;
					return rc;
				}
			}
		}else if( rc == UNQLITE_BUSY ){
			unqliteGenError(pPager->pDb,"Another process or thread have a reserved or exclusive lock on this database");
		}		
	}
	return rc;
}